

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ScanInteriorNode
              (char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piFirst,
              sqlite3_int64 *piLast)

{
  int iVar1;
  void *pvVar2;
  int local_b4;
  int local_9c;
  int local_98;
  bool local_92;
  char *zNew;
  int nBuffer;
  int nPrefix;
  int nSuffix;
  int cmp;
  sqlite3_int64 iChild;
  sqlite3_uint64 sStack_68;
  int isFirstTerm;
  i64 nAlloc;
  char *zBuffer;
  char *zEnd;
  char *zCsr;
  sqlite3_int64 *psStack_40;
  int rc;
  sqlite3_int64 *piLast_local;
  sqlite3_int64 *piFirst_local;
  char *pcStack_28;
  int nNode_local;
  char *zNode_local;
  char *pcStack_18;
  int nTerm_local;
  char *zTerm_local;
  
  zCsr._4_4_ = 0;
  zBuffer = zNode + nNode;
  nAlloc = 0;
  sStack_68 = 0;
  iChild._4_4_ = 1;
  zEnd = zNode;
  psStack_40 = piLast;
  piLast_local = piFirst;
  piFirst_local._4_4_ = nNode;
  pcStack_28 = zNode;
  zNode_local._4_4_ = nTerm;
  pcStack_18 = zTerm;
  iVar1 = sqlite3Fts3GetVarint(zNode,(sqlite_int64 *)&nSuffix);
  zEnd = zEnd + iVar1;
  iVar1 = sqlite3Fts3GetVarint(zEnd,(sqlite_int64 *)&nSuffix);
  zEnd = zEnd + iVar1;
  if (zBuffer < zEnd) {
    return 0x10b;
  }
  while( true ) {
    local_92 = false;
    if (zEnd < zBuffer) {
      local_92 = piLast_local != (sqlite3_int64 *)0x0 || psStack_40 != (long *)0x0;
    }
    if (!local_92) break;
    zNew._4_4_ = 0;
    if (iChild._4_4_ == 0) {
      if ((*zEnd & 0x80U) == 0) {
        zNew._4_4_ = (uint)(byte)*zEnd;
        local_98 = 1;
      }
      else {
        local_98 = sqlite3Fts3GetVarint32(zEnd,(int *)((long)&zNew + 4));
      }
      zEnd = zEnd + local_98;
    }
    iChild._4_4_ = 0;
    if ((*zEnd & 0x80U) == 0) {
      nBuffer = (int)(byte)*zEnd;
      local_9c = 1;
    }
    else {
      local_9c = sqlite3Fts3GetVarint32(zEnd,&nBuffer);
    }
    zEnd = zEnd + local_9c;
    if ((((long)zEnd - (long)pcStack_28 < (long)(int)zNew._4_4_) ||
        ((long)zBuffer - (long)zEnd < (long)nBuffer)) || (nBuffer == 0)) {
      zCsr._4_4_ = 0x10b;
      goto LAB_001f5bce;
    }
    pvVar2 = (void *)nAlloc;
    if ((long)sStack_68 < (long)(int)zNew._4_4_ + (long)nBuffer) {
      sStack_68 = ((long)(int)zNew._4_4_ + (long)nBuffer) * 2;
      pvVar2 = sqlite3_realloc64((void *)nAlloc,sStack_68);
      if (pvVar2 == (void *)0x0) {
        zCsr._4_4_ = 7;
LAB_001f5bce:
        sqlite3_free((void *)nAlloc);
        return zCsr._4_4_;
      }
    }
    nAlloc = (i64)pvVar2;
    memcpy((void *)(nAlloc + (int)zNew._4_4_),zEnd,(long)nBuffer);
    zNew._0_4_ = zNew._4_4_ + nBuffer;
    zEnd = zEnd + nBuffer;
    local_b4 = (int)zNew;
    if (zNode_local._4_4_ < (int)zNew) {
      local_b4 = zNode_local._4_4_;
    }
    nPrefix = memcmp(pcStack_18,(void *)nAlloc,(long)local_b4);
    if ((piLast_local != (sqlite3_int64 *)0x0) &&
       ((nPrefix < 0 || ((nPrefix == 0 && (zNode_local._4_4_ < (int)zNew)))))) {
      *piLast_local = _nSuffix;
      piLast_local = (sqlite3_int64 *)0x0;
    }
    if ((psStack_40 != (long *)0x0) && (nPrefix < 0)) {
      *psStack_40 = _nSuffix;
      psStack_40 = (long *)0x0;
    }
    _nSuffix = _nSuffix + 1;
  }
  if (piLast_local != (sqlite3_int64 *)0x0) {
    *piLast_local = _nSuffix;
  }
  if (psStack_40 != (long *)0x0) {
    *psStack_40 = _nSuffix;
  }
  goto LAB_001f5bce;
}

Assistant:

static int fts3ScanInteriorNode(
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piFirst,         /* OUT: Selected child node */
  sqlite3_int64 *piLast           /* OUT: Selected child node */
){
  int rc = SQLITE_OK;             /* Return code */
  const char *zCsr = zNode;       /* Cursor to iterate through node */
  const char *zEnd = &zCsr[nNode];/* End of interior node buffer */
  char *zBuffer = 0;              /* Buffer to load terms into */
  i64 nAlloc = 0;                 /* Size of allocated buffer */
  int isFirstTerm = 1;            /* True when processing first term on page */
  sqlite3_int64 iChild;           /* Block id of child node to descend to */

  /* Skip over the 'height' varint that occurs at the start of every 
  ** interior node. Then load the blockid of the left-child of the b-tree
  ** node into variable iChild.  
  **
  ** Even if the data structure on disk is corrupted, this (reading two
  ** varints from the buffer) does not risk an overread. If zNode is a
  ** root node, then the buffer comes from a SELECT statement. SQLite does
  ** not make this guarantee explicitly, but in practice there are always
  ** either more than 20 bytes of allocated space following the nNode bytes of
  ** contents, or two zero bytes. Or, if the node is read from the %_segments
  ** table, then there are always 20 bytes of zeroed padding following the
  ** nNode bytes of content (see sqlite3Fts3ReadBlock() for details).
  */
  zCsr += sqlite3Fts3GetVarint(zCsr, &iChild);
  zCsr += sqlite3Fts3GetVarint(zCsr, &iChild);
  if( zCsr>zEnd ){
    return FTS_CORRUPT_VTAB;
  }
  
  while( zCsr<zEnd && (piFirst || piLast) ){
    int cmp;                      /* memcmp() result */
    int nSuffix;                  /* Size of term suffix */
    int nPrefix = 0;              /* Size of term prefix */
    int nBuffer;                  /* Total term size */
  
    /* Load the next term on the node into zBuffer. Use realloc() to expand
    ** the size of zBuffer if required.  */
    if( !isFirstTerm ){
      zCsr += fts3GetVarint32(zCsr, &nPrefix);
    }
    isFirstTerm = 0;
    zCsr += fts3GetVarint32(zCsr, &nSuffix);
    
    assert( nPrefix>=0 && nSuffix>=0 );
    if( nPrefix>zCsr-zNode || nSuffix>zEnd-zCsr || nSuffix==0 ){
      rc = FTS_CORRUPT_VTAB;
      goto finish_scan;
    }
    if( (i64)nPrefix+nSuffix>nAlloc ){
      char *zNew;
      nAlloc = ((i64)nPrefix+nSuffix) * 2;
      zNew = (char *)sqlite3_realloc64(zBuffer, nAlloc);
      if( !zNew ){
        rc = SQLITE_NOMEM;
        goto finish_scan;
      }
      zBuffer = zNew;
    }
    assert( zBuffer );
    memcpy(&zBuffer[nPrefix], zCsr, nSuffix);
    nBuffer = nPrefix + nSuffix;
    zCsr += nSuffix;

    /* Compare the term we are searching for with the term just loaded from
    ** the interior node. If the specified term is greater than or equal
    ** to the term from the interior node, then all terms on the sub-tree 
    ** headed by node iChild are smaller than zTerm. No need to search 
    ** iChild.
    **
    ** If the interior node term is larger than the specified term, then
    ** the tree headed by iChild may contain the specified term.
    */
    cmp = memcmp(zTerm, zBuffer, (nBuffer>nTerm ? nTerm : nBuffer));
    if( piFirst && (cmp<0 || (cmp==0 && nBuffer>nTerm)) ){
      *piFirst = iChild;
      piFirst = 0;
    }

    if( piLast && cmp<0 ){
      *piLast = iChild;
      piLast = 0;
    }

    iChild++;
  };

  if( piFirst ) *piFirst = iChild;
  if( piLast ) *piLast = iChild;

 finish_scan:
  sqlite3_free(zBuffer);
  return rc;
}